

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O3

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const,Eigen::ArrayWrapper<Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::MatrixWrapper<Eigen::PartialReduxExpr<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,Eigen::internal::member_sum<double>,0>const>,0>>const>const>,Eigen::internal::assign_op<double,double>>
               (Matrix<double,__1,__1,_0,__1,__1> *dst,
               MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::MatrixWrapper<const_Eigen::PartialReduxExpr<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::member_sum<double>,_0>_>,_0>_>_>_>
               *src,assign_op<double,_double> *func)

{
  undefined1 (*pauVar1) [16];
  double *pdVar2;
  ulong cols;
  double *pdVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  undefined8 *puVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  Index index;
  ulong uVar10;
  double dVar11;
  double dVar15;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  SrcEvaluatorType srcEvaluator;
  product_evaluator<Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::MatrixWrapper<const_Eigen::PartialReduxExpr<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::member_sum<double>,_0>_>,_0>,_5,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  local_48;
  
  pdVar2 = (((src->m_expression).m_lhs.m_xpr.m_expression)->
           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  product_evaluator<Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::MatrixWrapper<const_Eigen::PartialReduxExpr<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::member_sum<double>,_0>_>,_0>,_5,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  ::product_evaluator(&local_48,&(src->m_expression).m_rhs.m_expression);
  uVar10 = (src->m_expression).m_rhs.m_expression.m_lhs.m_rows.m_value;
  cols = (((src->m_expression).m_rhs.m_expression.m_rhs.m_expression.m_matrix.m_xpr.m_expression)->
         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (((dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows !=
       uVar10) ||
     (uVar5 = cols, uVar7 = uVar10,
     (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols !=
     cols)) {
    if ((long)(cols | uVar10) < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/m-iDev-0792[P]HJNN/include/Eigen/src/Core/PlainObjectBase.h"
                    ,0x11d,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if ((cols != 0 && uVar10 != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)cols),0) <
        (long)uVar10)) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar6 = std::random_device::_M_fini;
      __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)dst,cols * uVar10,uVar10,cols);
    uVar7 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
    ;
    uVar5 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
    ;
  }
  if ((uVar7 == uVar10) && (uVar5 == cols)) {
    pdVar3 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    lVar8 = cols * uVar10;
    uVar10 = lVar8 - (lVar8 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < lVar8) {
      lVar9 = 0;
      do {
        pauVar1 = (undefined1 (*) [16])(pdVar2 + lVar9);
        auVar16 = *pauVar1;
        auVar14 = *pauVar1;
        if (pexp<double__vector(2)>(double(int)const)::p4i_1023_0 == '\0') {
          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const,Eigen::ArrayWrapper<Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::MatrixWrapper<Eigen::PartialReduxExpr<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,Eigen::internal::member_sum<double>,0>const>,0>>const>const>,Eigen::internal::assign_op<double,double>>
                    ();
        }
        auVar16 = minpd(auVar16,_DAT_00114070);
        auVar4._8_8_ = 0xc0862b7d369a5715;
        auVar4._0_8_ = 0xc0862b7d369a5715;
        auVar16 = maxpd(auVar16,auVar4);
        dVar18 = auVar16._0_8_ * 1.4426950408889634 + 0.5;
        dVar19 = auVar16._8_8_ * 1.4426950408889634 + 0.5;
        dVar11 = (double)(int)dVar18;
        dVar15 = (double)(int)dVar19;
        dVar11 = dVar11 - (double)(-(ulong)(dVar18 < dVar11) & 0x3ff0000000000000);
        dVar15 = dVar15 - (double)(-(ulong)(dVar19 < dVar15) & 0x3ff0000000000000);
        dVar20 = dVar11 * -0.693145751953125 + auVar16._0_8_ + dVar11 * -1.4286068203094173e-06;
        dVar21 = dVar15 * -0.693145751953125 + auVar16._8_8_ + dVar15 * -1.4286068203094173e-06;
        dVar18 = dVar20 * dVar20;
        dVar19 = dVar21 * dVar21;
        auVar17._0_8_ =
             ((dVar18 * 0.00012617719307481058 + 0.030299440770744195) * dVar18 + 1.0) * dVar20;
        auVar17._8_8_ =
             ((dVar19 * 0.00012617719307481058 + 0.030299440770744195) * dVar19 + 1.0) * dVar21;
        auVar16._8_8_ =
             (((dVar19 * 3.0019850513866446e-06 + 0.002524483403496841) * dVar19 +
              0.22726554820815503) * dVar19 + 2.0) - auVar17._8_8_;
        auVar16._0_8_ =
             (((dVar18 * 3.0019850513866446e-06 + 0.002524483403496841) * dVar18 +
              0.22726554820815503) * dVar18 + 2.0) - auVar17._0_8_;
        auVar16 = divpd(auVar17,auVar16);
        auVar12._0_8_ =
             (double)CONCAT44(((int)dVar11 + pexp<double__vector(2)>(double(int)const)::p4i_1023_0)
                              * 0x100000,DAT_001222ec << 0x14);
        auVar12._8_4_ = DAT_001222e8 << 0x14;
        auVar12._12_4_ = ((int)dVar15 + DAT_001222e4) * 0x100000;
        auVar13._0_8_ = auVar12._0_8_ * (auVar16._0_8_ + auVar16._0_8_ + 1.0);
        auVar13._8_8_ = auVar12._8_8_ * (auVar16._8_8_ + auVar16._8_8_ + 1.0);
        auVar14 = maxpd(auVar13,auVar14);
        auVar14 = divpd(auVar14,*(undefined1 (*) [16])
                                 (local_48.
                                  super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                  .m_data + lVar9));
        *(undefined1 (*) [16])(pdVar3 + lVar9) = auVar14;
        lVar9 = lVar9 + 2;
      } while (lVar9 < (long)uVar10);
    }
    if ((long)uVar10 < lVar8) {
      do {
        dVar11 = exp(pdVar2[uVar10]);
        pdVar3[uVar10] =
             dVar11 / local_48.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      .m_data[uVar10];
        uVar10 = uVar10 + 1;
      } while (lVar8 - uVar10 != 0);
    }
    free(local_48.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_data);
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/workspace/llm4binary/github/license_all_cmakelists_25/m-iDev-0792[P]HJNN/include/Eigen/src/Core/AssignEvaluator.h"
                ,0x2d1,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>, const Eigen::ArrayWrapper<const Eigen::Matrix<double, -1, -1>>>, const Eigen::ArrayWrapper<Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>, Eigen::MatrixWrapper<const Eigen::PartialReduxExpr<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>, const Eigen::ArrayWrapper<const Eigen::Matrix<double, -1, -1>>>, Eigen::internal::member_sum<double>, 0>>>>>>, T1 = double, T2 = double]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);
    
  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}